

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

void __thiscall StringBuffer::appendChar(StringBuffer *this,char c)

{
  long lVar1;
  void *pvVar2;
  undefined1 in_SIL;
  long *in_RDI;
  long addThis;
  ulong local_18;
  
  if (in_RDI[2] == in_RDI[1]) {
    local_18 = (ulong)in_RDI[2] >> 3;
    if ((long)local_18 < sbDefaultBoost) {
      local_18 = sbDefaultBoost;
    }
    in_RDI[2] = local_18 + in_RDI[2];
    pvVar2 = realloc((void *)*in_RDI,in_RDI[2] + 1);
    *in_RDI = (long)pvVar2;
  }
  *(undefined1 *)(*in_RDI + in_RDI[1]) = in_SIL;
  lVar1 = in_RDI[1];
  in_RDI[1] = lVar1 + 1;
  *(undefined1 *)(*in_RDI + 1 + lVar1) = 0;
  return;
}

Assistant:

void StringBuffer::appendChar(const char c) {
  long addThis;
  if (saLength == sLength) {
    addThis = saLength / 8;
    if (StringBuffer::sbDefaultBoost > addThis)
      addThis = StringBuffer::sbDefaultBoost;
    saLength += addThis;
    sData = (char *)realloc(sData, sizeof(char) * (saLength + 1));
  }
  sData[sLength] = c;
  sData[++sLength] = 0;
}